

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O2

TextureFormat glu::mapGLTransferFormat(deUint32 format,deUint32 dataType)

{
  bool bVar1;
  bool normalized;
  ChannelType CVar2;
  InternalError *this;
  ulong uStack_120;
  allocator<char> local_109;
  ulong local_108;
  ulong local_100;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  normalized = true;
  bVar1 = true;
  switch(format) {
  case 0x1902:
    uStack_120 = 0x12;
    break;
  case 0x1903:
switchD_008a1d36_caseD_1903:
    normalized = bVar1;
    uStack_120 = 0;
    break;
  case 0x1904:
  case 0x1905:
switchD_008a1d36_caseD_1904:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Can\'t map GL pixel format (",&local_109);
    local_100 = (ulong)format;
    tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_d8,&local_100);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,", ");
    local_108 = (ulong)dataType;
    tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_f8,&local_108);
    std::operator+(&local_58,&local_78,&local_f8);
    std::operator+(&local_38,&local_58,") to texture format");
    tcu::InternalError::InternalError(this,&local_38);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  case 0x1906:
    uStack_120 = 1;
    break;
  case 0x1907:
    uStack_120 = 7;
    break;
  case 0x1908:
    uStack_120 = 8;
    break;
  case 0x1909:
    uStack_120 = 3;
    break;
  case 0x190a:
    uStack_120 = 4;
    break;
  default:
    if (format == 0x80e1) {
      uStack_120 = 0xb;
      break;
    }
    if (format == 0x8227) {
      uStack_120 = 5;
      break;
    }
    if (format == 0x8228) {
      uStack_120 = 5;
    }
    else {
      if (format == 0x84f9) {
        uStack_120 = 0x14;
        break;
      }
      if (format == 0x8d94) {
        bVar1 = false;
        goto switchD_008a1d36_caseD_1903;
      }
      if (format == 0x8d98) {
        uStack_120 = 7;
      }
      else {
        if (format != 0x8d99) goto switchD_008a1d36_caseD_1904;
        uStack_120 = 8;
      }
    }
    normalized = false;
  }
  CVar2 = mapGLChannelType(dataType,normalized);
  return (TextureFormat)((ulong)CVar2 << 0x20 | uStack_120);
}

Assistant:

tcu::TextureFormat mapGLTransferFormat (deUint32 format, deUint32 dataType)
{
	using tcu::TextureFormat;
	switch (format)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		mapGLChannelType(dataType, true));
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		mapGLChannelType(dataType, true));
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		mapGLChannelType(dataType, true));
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	mapGLChannelType(dataType, true));
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	mapGLChannelType(dataType, true));
		case GL_BGRA:				return TextureFormat(TextureFormat::BGRA,	mapGLChannelType(dataType, true));
		case GL_RG:					return TextureFormat(TextureFormat::RG,		mapGLChannelType(dataType, true));
		case GL_RED:				return TextureFormat(TextureFormat::R,		mapGLChannelType(dataType, true));
		case GL_RGBA_INTEGER:		return TextureFormat(TextureFormat::RGBA,	mapGLChannelType(dataType, false));
		case GL_RGB_INTEGER:		return TextureFormat(TextureFormat::RGB,	mapGLChannelType(dataType, false));
		case GL_RG_INTEGER:			return TextureFormat(TextureFormat::RG,		mapGLChannelType(dataType, false));
		case GL_RED_INTEGER:		return TextureFormat(TextureFormat::R,		mapGLChannelType(dataType, false));

		case GL_DEPTH_COMPONENT:	return TextureFormat(TextureFormat::D,		mapGLChannelType(dataType, true));
		case GL_DEPTH_STENCIL:		return TextureFormat(TextureFormat::DS,		mapGLChannelType(dataType, true));

		default:
			throw tcu::InternalError(string("Can't map GL pixel format (") + tcu::toHex(format).toString() + ", " + tcu::toHex(dataType).toString() + ") to texture format");
	}
}